

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O2

void aiTransformVecByMatrix4(aiVector3D *vec,aiMatrix4x4 *mat)

{
  if (mat == (aiMatrix4x4 *)0x0) {
    __assert_fail("__null != mat",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0x277,"void aiTransformVecByMatrix4(aiVector3D *, const aiMatrix4x4 *)");
  }
  if (vec != (aiVector3D *)0x0) {
    aiVector3t<float>::operator*=(vec,mat);
    return;
  }
  __assert_fail("__null != vec",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x278,"void aiTransformVecByMatrix4(aiVector3D *, const aiMatrix4x4 *)");
}

Assistant:

ASSIMP_API void aiTransformVecByMatrix4(aiVector3D* vec,
    const aiMatrix4x4* mat)
{
    ai_assert( NULL != mat );
    ai_assert( NULL != vec );

    *vec *= (*mat);
}